

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O2

wchar_t lookup_curse(char *name)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  char **ppcVar4;
  
  bVar1 = z_info->curse_max;
  ppcVar4 = &curses[1].name;
  for (uVar3 = 1; uVar3 < bVar1; uVar3 = uVar3 + 1) {
    if (*ppcVar4 != (char *)0x0) {
      iVar2 = strcmp(name,*ppcVar4);
      if (iVar2 == 0) goto LAB_00181915;
    }
    ppcVar4 = ppcVar4 + 7;
  }
  uVar3 = 0;
LAB_00181915:
  return (wchar_t)uVar3;
}

Assistant:

int lookup_curse(const char *name)
{
	int i;

	for (i = 1; i < z_info->curse_max; i++) {
		struct curse *curse = &curses[i];
		if (curse->name && streq(name, curse->name))
			return i;
	}
	return 0;
}